

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightBounds * __thiscall
pbrt::GoniometricLight::Bounds(LightBounds *__return_storage_ptr__,GoniometricLight *this)

{
  undefined8 uVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float *pfVar10;
  long lVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  uint local_90;
  undefined1 local_60 [32];
  size_t local_40;
  ulong local_38;
  
  TVar2 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  iVar16 = TVar2.y;
  uVar17 = TVar2.x;
  if (iVar16 < 1) {
    fVar19 = 0.0;
  }
  else {
    uVar15 = 0;
    auVar20 = ZEXT416(0) << 0x20;
    do {
      local_90 = auVar20._0_4_;
      fVar19 = sinf((((float)(int)uVar15 + 0.5) * 3.1415927) / (float)iVar16);
      if ((int)uVar17 < 1) {
        auVar20 = ZEXT416(local_90);
      }
      else {
        uVar14 = 0;
        do {
          Image::GetChannels((ImageChannelValues *)local_60,&this->image,
                             (Point2i)(uVar15 << 0x20 | uVar14),
                             (array<pbrt::WrapMode,_2>)
                             *(array<pbrt::WrapMode,_2> *)(this->wrapMode).wrap.values);
          pfVar10 = (float *)local_60._8_8_;
          if ((float *)local_60._8_8_ == (float *)0x0) {
            pfVar10 = (float *)(local_60 + 0x10);
          }
          fVar21 = *pfVar10;
          auVar23 = ZEXT464((uint)fVar21);
          if (1 < local_38) {
            uVar12 = 1;
            do {
              pfVar13 = pfVar10 + uVar12;
              uVar12 = uVar12 + 1;
              auVar20 = vmaxss_avx(ZEXT416((uint)*pfVar13),auVar23._0_16_);
              auVar23 = ZEXT1664(auVar20);
              fVar21 = auVar20._0_4_;
            } while (local_38 != uVar12);
          }
          local_38 = 0;
          (*(*(_func_int ***)local_60._0_8_)[3])(local_60._0_8_,local_60._8_8_,local_40 << 2,4);
          uVar14 = uVar14 + 1;
          auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar21),ZEXT416((uint)fVar19),ZEXT416(local_90));
          local_90 = auVar20._0_4_;
        } while (uVar14 != (uVar17 & 0x7fffffff));
      }
      fVar19 = auVar20._0_4_;
      uVar15 = uVar15 + 1;
    } while (uVar15 != (ulong)TVar2 >> 0x20);
  }
  pfVar10 = (this->I).values.ptr;
  uVar15 = (this->I).values.nStored;
  if (1 < uVar15) {
    auVar23 = ZEXT464((uint)*pfVar10);
    lVar11 = uVar15 * 4 + -4;
    pfVar13 = pfVar10;
    do {
      pfVar13 = pfVar13 + 1;
      fVar21 = auVar23._0_4_;
      auVar20 = vmaxss_avx(ZEXT416((uint)*pfVar13),auVar23._0_16_);
      auVar23 = ZEXT1664(auVar20);
      if (fVar21 < *pfVar13) {
        pfVar10 = pfVar13;
      }
      lVar11 = lVar11 + -4;
    } while (lVar11 != 0);
  }
  fVar6 = this->scale * *pfVar10;
  auVar22 = ZEXT816(0);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[0][1] * 0.0))
                            ,auVar22,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]
                                            ));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[1][1] * 0.0)),
                           auVar22,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]))
  ;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0)),
                           auVar22,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]))
  ;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar22,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]))
  ;
  auVar20 = vfmadd231ss_fma(auVar20,auVar22,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  auVar7 = vfmadd231ss_fma(auVar7,auVar22,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  auVar8 = vfmadd231ss_fma(auVar8,auVar22,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  auVar9 = vfmadd231ss_fma(auVar9,auVar22,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  fVar21 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  fVar4 = auVar20._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  fVar5 = auVar7._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  fVar18 = auVar9._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  bVar3 = fVar21 == 1.0;
  fVar18 = (float)((uint)bVar3 * (int)fVar18 + (uint)!bVar3 * (int)(fVar18 / fVar21));
  auVar20 = vinsertps_avx(ZEXT416((uint)bVar3 * (int)fVar4 + (uint)!bVar3 * (int)(fVar4 / fVar21)),
                          ZEXT416((uint)bVar3 * (int)fVar5 + (uint)!bVar3 * (int)(fVar5 / fVar21)),
                          0x10);
  uVar1 = vmovlps_avx(auVar20);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar18;
  uVar1 = vmovlps_avx(auVar20);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar18;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  __return_storage_ptr__->phi =
       (fVar19 * (fVar6 + fVar6) * 3.1415927 * 3.1415927) / (float)(int)(iVar16 * uVar17);
  __return_storage_ptr__->theta_o = 3.1415927;
  __return_storage_ptr__->theta_e = 1.5707964;
  __return_storage_ptr__->cosTheta_o = -1.0;
  __return_storage_ptr__->cosTheta_e = -4.371139e-08;
  __return_storage_ptr__->twoSided = false;
  return __return_storage_ptr__;
}

Assistant:

LightBounds GoniometricLight::Bounds() const {
    // Like Phi() method, but compute the weighted max component value of
    // the image map.
    Float weightedMaxImageSum = 0;
    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        Float sinTheta = std::sin(Pi * Float(v + .5f) / Float(height));
        for (int u = 0; u < width; ++u)
            weightedMaxImageSum +=
                sinTheta * image.GetChannels({u, v}, wrapMode).MaxValue();
    }
    Float phi =
        scale * I.MaxValue() * 2 * Pi * Pi * weightedMaxImageSum / (width * height);

    Point3f p = renderFromLight(Point3f(0, 0, 0));
    // Bound it as an isotropic point light.
    return LightBounds(p, Vector3f(0, 0, 1), phi, Pi, Pi / 2, false);
}